

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_node.cpp
# Opt level: O0

void __thiscall duckdb::QueryNode::AddDistinct(QueryNode *this)

{
  bool bVar1;
  type pRVar2;
  long in_RDI;
  DistinctModifier *distinct_modifier;
  ResultModifier *modifier;
  idx_t modifier_idx;
  unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>_>
  *in_stack_ffffffffffffff98;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
  *in_stack_ffffffffffffffa0;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *in_stack_ffffffffffffffb0;
  DistinctModifier *in_stack_ffffffffffffffe0;
  size_type local_10;
  
  for (local_10 = ::std::
                  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                  ::size((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                          *)(in_RDI + 0x10)); local_10 != 0; local_10 = local_10 - 1) {
    vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
    ::operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    pRVar2 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>::
             operator*((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                        *)in_stack_ffffffffffffffa0);
    if (pRVar2->type == DISTINCT_MODIFIER) {
      in_stack_ffffffffffffffe0 =
           ResultModifier::Cast<duckdb::DistinctModifier>
                     (&in_stack_ffffffffffffffe0->super_ResultModifier);
      bVar1 = ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::empty(in_stack_ffffffffffffffb0);
      if (bVar1) {
        return;
      }
    }
    else if ((pRVar2->type == LIMIT_MODIFIER) || (pRVar2->type == LIMIT_PERCENT_MODIFIER)) break;
  }
  this_00 = (vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             *)&stack0xffffffffffffffd0;
  make_uniq<duckdb::DistinctModifier>();
  unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>::
  unique_ptr<duckdb::DistinctModifier,std::default_delete<std::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>>>,void>
            ((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)this_00,in_stack_ffffffffffffff98);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
  ::push_back(this_00,(value_type *)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)0x23a6a1);
  unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
               *)0x23a6ab);
  return;
}

Assistant:

void QueryNode::AddDistinct() {
	// check if we already have a DISTINCT modifier
	for (idx_t modifier_idx = modifiers.size(); modifier_idx > 0; modifier_idx--) {
		auto &modifier = *modifiers[modifier_idx - 1];
		if (modifier.type == ResultModifierType::DISTINCT_MODIFIER) {
			auto &distinct_modifier = modifier.Cast<DistinctModifier>();
			if (distinct_modifier.distinct_on_targets.empty()) {
				// we have a DISTINCT without an ON clause - this distinct does not need to be added
				return;
			}
		} else if (modifier.type == ResultModifierType::LIMIT_MODIFIER ||
		           modifier.type == ResultModifierType::LIMIT_PERCENT_MODIFIER) {
			// we encountered a LIMIT or LIMIT PERCENT - these change the result of DISTINCT, so we do need to push a
			// DISTINCT relation
			break;
		}
	}
	modifiers.push_back(make_uniq<DistinctModifier>());
}